

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gls::BindAliasingAttributeTest::iterate(BindAliasingAttributeTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  undefined1 local_1a8 [24];
  long *local_190;
  long local_188;
  long local_180 [2];
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  undefined1 local_160 [24];
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  bindings;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  string local_108;
  Attribute local_e8;
  long *local_68;
  long local_60;
  long local_58 [2];
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170 = (undefined1  [8])local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"a_0","");
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"A","");
  local_1b8[0] = 1;
  local_1b0._M_p = local_1a8 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_190,local_188 + (long)local_190);
  AttributeLocationTestUtil::Attribute::Attribute
            (&local_e8,&this->m_type,(string *)local_170,-1,(Cond *)local_1b8,this->m_arraySize);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_e8);
  paVar1 = &local_e8.m_cond.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_cond.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.m_cond.m_name._M_dataplus._M_p,
                    local_e8.m_cond.m_name.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_e8.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8.m_name._M_dataplus._M_p,
                    local_e8.m_name.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_e8.m_type.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_type.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_e8.m_type.m_name._M_dataplus._M_p,
                    local_e8.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0._M_p != local_1a8 + 8) {
    operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
  }
  if (local_190 != local_180) {
    operator_delete(local_190,local_180[0] + 1);
  }
  if (local_170 != (undefined1  [8])local_160) {
    operator_delete((void *)local_170,local_160._0_8_ + 1);
  }
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"vec4","");
  local_1b8 = (undefined1  [8])local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,local_190,local_188 + (long)local_190);
  local_1a8._16_4_ = 1;
  local_1a8._20_4_ = 0x8b52;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"a_1","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"A","");
  local_170 = (undefined1  [8])((ulong)local_170 & 0xffffffffffffff00);
  local_168._M_p = local_160 + 8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,local_68,local_60 + (long)local_68)
  ;
  AttributeLocationTestUtil::Attribute::Attribute
            (&local_e8,(AttribType *)local_1b8,&local_108,-1,(Cond *)local_170,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_cond.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.m_cond.m_name._M_dataplus._M_p,
                    local_e8.m_cond.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8.m_name._M_dataplus._M_p,
                    local_e8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_type.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_e8.m_type.m_name._M_dataplus._M_p,
                    local_e8.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_168._M_p != local_160 + 8) {
    operator_delete(local_168._M_p,local_160._8_8_ + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
  }
  if (local_190 != local_180) {
    operator_delete(local_190,local_180[0] + 1);
  }
  local_1b8 = (undefined1  [8])local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"a_0","");
  local_e8.m_type.m_name._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_1b8,local_1b0._M_p + (long)local_1b8);
  local_e8.m_type.m_locationSize = 1;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_type.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_e8.m_type.m_name._M_dataplus._M_p,
                    local_e8.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
  }
  local_1b8 = (undefined1  [8])local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"a_1","");
  iVar4 = this->m_offset;
  local_e8.m_type.m_name._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_1b8,local_1b0._M_p + (long)local_1b8);
  local_e8.m_type.m_locationSize = iVar4 + 1;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_type.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_e8.m_type.m_name._M_dataplus._M_p,
                    local_e8.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
  }
  local_e8.m_type.m_name._M_dataplus._M_p = (pointer)0x0;
  local_e8.m_type.m_name._M_string_length = 0;
  local_e8.m_type.m_name.field_2._M_allocated_capacity = 0;
  AttributeLocationTestUtil::runTest
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,&attributes,
             &noBindings,&bindings,&noBindings,false,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&local_e8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&local_e8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&bindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult BindAliasingAttributeTest::iterate (void)
{
	const vector<Bind>	noBindings;

	vector<Attribute>	attributes;
	vector<Bind>		bindings;

	attributes.push_back(Attribute(m_type, "a_0", Attribute::LOC_UNDEF, Cond("A", true), m_arraySize));
	attributes.push_back(Attribute(AttribType("vec4", 1, GL_FLOAT_VEC4), "a_1", Attribute::LOC_UNDEF, Cond("A", false)));
	bindings.push_back(Bind("a_0", 1));
	bindings.push_back(Bind("a_1", 1 + m_offset));

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, bindings, noBindings, false);
	return STOP;
}